

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

float tcu::sampleLevelArray2DCompare
                (ConstPixelBufferAccess *levels,int numLevels,Sampler *sampler,float ref,float s,
                float t,float lod,IVec3 *offset)

{
  int iVar1;
  int iVar2;
  FilterMode FVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  FVar3 = (&sampler->minFilter)[lod <= sampler->lodThreshold];
  switch(FVar3) {
  case NEAREST:
    FVar3 = NEAREST;
    break;
  case LINEAR:
    FVar3 = LINEAR;
    break;
  case NEAREST_MIPMAP_NEAREST:
  case LINEAR_MIPMAP_NEAREST:
    fVar6 = ceilf(lod + 0.5);
    iVar5 = (int)fVar6 + -1;
    iVar1 = numLevels + -1;
    if (iVar5 < numLevels + -1) {
      iVar1 = iVar5;
    }
    iVar2 = 0;
    if (-1 < iVar5) {
      iVar2 = iVar1;
    }
    FVar3 = (FilterMode)(FVar3 == LINEAR_MIPMAP_NEAREST);
    levels = levels + iVar2;
    break;
  case NEAREST_MIPMAP_LINEAR:
  case LINEAR_MIPMAP_LINEAR:
    iVar5 = numLevels + -1;
    fVar6 = floorf(lod);
    iVar2 = (int)fVar6;
    iVar1 = iVar5;
    if (iVar2 < iVar5) {
      iVar1 = iVar2;
    }
    iVar4 = 0;
    if (-1 < iVar2) {
      iVar4 = iVar1;
    }
    if (iVar4 + 1 <= iVar5) {
      iVar5 = iVar4 + 1;
    }
    fVar7 = ConstPixelBufferAccess::sample2DCompare
                      (levels + iVar4,sampler,(uint)(FVar3 == LINEAR_MIPMAP_LINEAR),ref,s,t,offset);
    fVar8 = ConstPixelBufferAccess::sample2DCompare
                      (levels + iVar5,sampler,(uint)(FVar3 == LINEAR_MIPMAP_LINEAR),ref,s,t,offset);
    return fVar8 * (lod - fVar6) + (1.0 - (lod - fVar6)) * fVar7;
  default:
    return 0.0;
  }
  fVar6 = ConstPixelBufferAccess::sample2DCompare(levels,sampler,FVar3,ref,s,t,offset);
  return fVar6;
}

Assistant:

float sampleLevelArray2DCompare (const ConstPixelBufferAccess* levels, int numLevels, const Sampler& sampler, float ref, float s, float t, float lod, const IVec3& offset)
{
	bool					magnified	= lod <= sampler.lodThreshold;
	Sampler::FilterMode		filterMode	= magnified ? sampler.magFilter : sampler.minFilter;

	switch (filterMode)
	{
		case Sampler::NEAREST:	return levels[0].sample2DCompare(sampler, filterMode, ref, s, t, offset);
		case Sampler::LINEAR:	return levels[0].sample2DCompare(sampler, filterMode, ref, s, t, offset);

		case Sampler::NEAREST_MIPMAP_NEAREST:
		case Sampler::LINEAR_MIPMAP_NEAREST:
		{
			int					maxLevel	= (int)numLevels-1;
			int					level		= deClamp32((int)deFloatCeil(lod + 0.5f) - 1, 0, maxLevel);
			Sampler::FilterMode	levelFilter	= (filterMode == Sampler::LINEAR_MIPMAP_NEAREST) ? Sampler::LINEAR : Sampler::NEAREST;

			return levels[level].sample2DCompare(sampler, levelFilter, ref, s, t, offset);
		}

		case Sampler::NEAREST_MIPMAP_LINEAR:
		case Sampler::LINEAR_MIPMAP_LINEAR:
		{
			int					maxLevel	= (int)numLevels-1;
			int					level0		= deClamp32((int)deFloatFloor(lod), 0, maxLevel);
			int					level1		= de::min(maxLevel, level0 + 1);
			Sampler::FilterMode	levelFilter	= (filterMode == Sampler::LINEAR_MIPMAP_LINEAR) ? Sampler::LINEAR : Sampler::NEAREST;
			float				f			= deFloatFrac(lod);
			float				t0			= levels[level0].sample2DCompare(sampler, levelFilter, ref, s, t, offset);
			float				t1			= levels[level1].sample2DCompare(sampler, levelFilter, ref, s, t, offset);

			return t0*(1.0f - f) + t1*f;
		}

		default:
			DE_ASSERT(DE_FALSE);
			return 0.0f;
	}
}